

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c6280_mame.c
# Opt level: O1

UINT8 device_start_c6280_mame(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT8 UVar1;
  c6280_t *info;
  DEV_DATA DVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  double dVar6;
  
  uVar3 = cfg->clock;
  if ((cfg->srMode == '\x01') ||
     ((uVar5 = uVar3 >> 4, cfg->srMode == '\x02' && (uVar5 < cfg->smplRate)))) {
    uVar5 = cfg->smplRate;
  }
  DVar2.chipInf = calloc(1,0x4290);
  if (DVar2.chipInf == (void *)0x0) {
    DVar2.chipInf = (void *)0x0;
  }
  else {
    dVar6 = (double)uVar3 / (double)uVar5;
    uVar3 = 1;
    do {
      *(int *)((long)DVar2.chipInf + (ulong)(uVar3 & 0xfff) * 4 + 0x28c) =
           (int)(long)((dVar6 * 4096.0) / (double)(int)uVar3);
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x1001);
    lVar4 = 0x83;
    do {
      *(int *)((long)DVar2.chipInf + lVar4 * 4) =
           (int)(long)((dVar6 * 32.0) / (double)((int)lVar4 + -0x82));
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0xa3);
    dVar6 = 341.3333333333333;
    lVar4 = 0xe6;
    do {
      *(short *)((long)DVar2.chipInf + lVar4 * 2) = (short)(int)dVar6;
      dVar6 = dVar6 / 1.1885022274370185;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x105);
    *(undefined2 *)((long)DVar2.chipInf + 0x20a) = 0;
    lVar4 = 0x40;
    do {
      *(undefined1 *)((long)DVar2.chipInf + lVar4) = 0;
      lVar4 = lVar4 + 0x38;
    } while (lVar4 != 400);
  }
  if (DVar2.chipInf == (void *)0x0) {
    UVar1 = 0xff;
  }
  else {
    *(void **)DVar2.chipInf = DVar2.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar2.chipInf;
    retDevInf->sampleRate = uVar5;
    retDevInf->devDef = &devDef_C6280_MAME;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

static UINT8 device_start_c6280_mame(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 16;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = device_start_c6280mame(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_C6280_MAME);
	return 0x00;
}